

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::SetLanguageEnabledMaps(cmGlobalGenerator *this,string *l,cmMakefile *mf)

{
  int iVar1;
  iterator iVar2;
  char *pcVar3;
  mapped_type_conflict *pmVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  pointer __k;
  allocator local_121;
  int preference;
  allocator local_119;
  string ignoreExtensionsVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensionList;
  string ignoreExts;
  string outputExtensionVar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string linkerPrefVar;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->LanguageToLinkerPreference)._M_t,l);
  if ((_Rb_tree_header *)iVar2._M_node !=
      &(this->LanguageToLinkerPreference)._M_t._M_impl.super__Rb_tree_header) {
    return;
  }
  std::__cxx11::string::string((string *)&ignoreExtensionsVar,"CMAKE_",(allocator *)&local_90);
  std::__cxx11::string::string((string *)&ignoreExts,(string *)l);
  std::operator+(&outputExtensionVar,&ignoreExtensionsVar,&ignoreExts);
  std::__cxx11::string::string((string *)&extensionList,"_LINKER_PREFERENCE",(allocator *)&local_70)
  ;
  std::operator+(&linkerPrefVar,&outputExtensionVar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extensionList
                );
  std::__cxx11::string::~string((string *)&extensionList);
  std::__cxx11::string::~string((string *)&outputExtensionVar);
  std::__cxx11::string::~string((string *)&ignoreExts);
  std::__cxx11::string::~string((string *)&ignoreExtensionsVar);
  pcVar3 = cmMakefile::GetDefinition(mf,&linkerPrefVar);
  preference = 0;
  if (pcVar3 != (char *)0x0) {
    iVar1 = __isoc99_sscanf(pcVar3,"%d",&preference);
    if (iVar1 == 1) {
      if (preference < 0) {
        std::__cxx11::string::string((string *)&outputExtensionVar,(string *)&linkerPrefVar);
        std::__cxx11::string::append((char *)&outputExtensionVar);
        cmSystemTools::Message(outputExtensionVar._M_dataplus._M_p,"Warning");
        preference = 0;
        std::__cxx11::string::~string((string *)&outputExtensionVar);
      }
      goto LAB_002cb261;
    }
    if (*pcVar3 == 'P') {
      preference = 100;
      goto LAB_002cb261;
    }
  }
  preference = 0;
LAB_002cb261:
  iVar1 = preference;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->LanguageToLinkerPreference,l);
  *pmVar4 = iVar1;
  std::__cxx11::string::string((string *)&ignoreExts,"CMAKE_",(allocator *)&local_70);
  std::__cxx11::string::string((string *)&extensionList,(string *)l);
  std::operator+(&ignoreExtensionsVar,&ignoreExts,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extensionList
                );
  std::__cxx11::string::string((string *)&local_90,"_OUTPUT_EXTENSION",&local_121);
  std::operator+(&outputExtensionVar,&ignoreExtensionsVar,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&ignoreExtensionsVar);
  std::__cxx11::string::~string((string *)&extensionList);
  std::__cxx11::string::~string((string *)&ignoreExts);
  pcVar3 = cmMakefile::GetDefinition(mf,&outputExtensionVar);
  if (pcVar3 != (char *)0x0) {
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->LanguageToOutputExtension,l);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::string((string *)&ignoreExtensionsVar,pcVar3,(allocator *)&ignoreExts);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->OutputExtensions,&ignoreExtensionsVar);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::~string((string *)&ignoreExtensionsVar);
    if (*pcVar3 == '.') {
      std::__cxx11::string::string
                ((string *)&ignoreExtensionsVar,pcVar3 + 1,(allocator *)&ignoreExts);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->OutputExtensions,&ignoreExtensionsVar);
      std::__cxx11::string::assign((char *)pmVar5);
      std::__cxx11::string::~string((string *)&ignoreExtensionsVar);
    }
  }
  FillExtensionToLanguageMap(this,l,mf);
  std::__cxx11::string::string((string *)&extensionList,"CMAKE_",&local_121);
  std::__cxx11::string::string((string *)&local_90,(string *)l);
  std::operator+(&ignoreExts,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extensionList
                 ,&local_90);
  std::__cxx11::string::string((string *)&local_70,"_IGNORE_EXTENSIONS",&local_119);
  std::operator+(&ignoreExtensionsVar,&ignoreExts,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&ignoreExts);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&extensionList);
  pcVar3 = cmMakefile::GetSafeDefinition(mf,&ignoreExtensionsVar);
  std::__cxx11::string::string((string *)&ignoreExts,pcVar3,(allocator *)&extensionList);
  extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmSystemTools::ExpandListArgument(&ignoreExts,&extensionList,false);
  for (__k = extensionList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __k != extensionList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&this->IgnoreExtensions,__k);
    *pmVar6 = true;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&extensionList);
  std::__cxx11::string::~string((string *)&ignoreExts);
  std::__cxx11::string::~string((string *)&ignoreExtensionsVar);
  std::__cxx11::string::~string((string *)&outputExtensionVar);
  std::__cxx11::string::~string((string *)&linkerPrefVar);
  return;
}

Assistant:

void cmGlobalGenerator::SetLanguageEnabledMaps(const std::string& l,
                                               cmMakefile* mf)
{
  // use LanguageToLinkerPreference to detect whether this functions has
  // run before
  if (this->LanguageToLinkerPreference.find(l) !=
                                        this->LanguageToLinkerPreference.end())
    {
    return;
    }

  std::string linkerPrefVar = std::string("CMAKE_") +
    std::string(l) + std::string("_LINKER_PREFERENCE");
  const char* linkerPref = mf->GetDefinition(linkerPrefVar);
  int preference = 0;
  if(linkerPref)
    {
    if (sscanf(linkerPref, "%d", &preference)!=1)
      {
      // backward compatibility: before 2.6 LINKER_PREFERENCE
      // was either "None" or "Preferred", and only the first character was
      // tested. So if there is a custom language out there and it is
      // "Preferred", set its preference high
      if (linkerPref[0]=='P')
        {
        preference = 100;
        }
      else
        {
        preference = 0;
        }
      }
    }

  if (preference < 0)
    {
    std::string msg = linkerPrefVar;
    msg += " is negative, adjusting it to 0";
    cmSystemTools::Message(msg.c_str(), "Warning");
    preference = 0;
    }

  this->LanguageToLinkerPreference[l] = preference;

  std::string outputExtensionVar = std::string("CMAKE_") +
    std::string(l) + std::string("_OUTPUT_EXTENSION");
  const char* outputExtension = mf->GetDefinition(outputExtensionVar);
  if(outputExtension)
    {
    this->LanguageToOutputExtension[l] = outputExtension;
    this->OutputExtensions[outputExtension] = outputExtension;
    if(outputExtension[0] == '.')
      {
      this->OutputExtensions[outputExtension+1] = outputExtension+1;
      }
    }

  // The map was originally filled by SetLanguageEnabledFlag, but
  // since then the compiler- and platform-specific files have been
  // loaded which might have added more entries.
  this->FillExtensionToLanguageMap(l, mf);

  std::string ignoreExtensionsVar = std::string("CMAKE_") +
    std::string(l) + std::string("_IGNORE_EXTENSIONS");
  std::string ignoreExts = mf->GetSafeDefinition(ignoreExtensionsVar);
  std::vector<std::string> extensionList;
  cmSystemTools::ExpandListArgument(ignoreExts, extensionList);
  for(std::vector<std::string>::iterator i = extensionList.begin();
      i != extensionList.end(); ++i)
    {
    this->IgnoreExtensions[*i] = true;
    }

}